

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

int bmcg_sat_solver_add_and
              (bmcg_sat_solver *s,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1,int fCompl)

{
  int iVar2;
  int iVar3;
  int Lits [3];
  
  Lits[0] = Abc_Var2Lit(iVar,(uint)(fCompl == 0));
  Lits[1] = Abc_Var2Lit(iVar0,fCompl0);
  iVar2 = glucose_solver_addclause((SimpSolver *)s,Lits,2);
  iVar3 = 0;
  if (iVar2 != 0) {
    Lits[0] = Abc_Var2Lit(iVar,(uint)(fCompl == 0));
    Lits[1] = Abc_Var2Lit(iVar1,fCompl1);
    iVar2 = glucose_solver_addclause((SimpSolver *)s,Lits,2);
    iVar3 = 0;
    if (iVar2 != 0) {
      Lits[0] = Abc_Var2Lit(iVar,fCompl);
      Lits[1] = Abc_Var2Lit(iVar0,(uint)(fCompl0 == 0));
      Lits[2] = Abc_Var2Lit(iVar1,(uint)(fCompl1 == 0));
      iVar3 = glucose_solver_addclause((SimpSolver *)s,Lits,3);
    }
  }
  return iVar3;
}

Assistant:

int bmcg_sat_solver_add_and( bmcg_sat_solver * s, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1, int fCompl )
{
    int Lits[3];

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, fCompl0 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar1, fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar,   fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, !fCompl0 );
    Lits[2] = Abc_Var2Lit( iVar1, !fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 3 ) )
        return 0;

    return 1;
}